

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void advance_engine<trng::yarn4>(yarn4 *r1,yarn4 *r2,long N)

{
  long in_RDX;
  long i;
  yarn4 *this;
  
  for (this = (yarn4 *)0x0; (long)this < in_RDX; this = (yarn4 *)((long)(this->P).a + 1)) {
    trng::yarn4::operator()(this);
    trng::yarn4::operator()(this);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}